

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

void zisofs_detect_magic(archive_write *a,void *buff,size_t s)

{
  char *pcVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  
  lVar5 = *(long *)&(a->archive).archive_format;
  uVar6 = archive_entry_size(*(archive_entry **)(lVar5 + 0x20));
  uVar12 = 0x40;
  if ((long)uVar6 < 0x40) {
    uVar12 = uVar6;
  }
  iVar13 = *(int *)((long)&a[1].client_writer + 4);
  lVar7 = (long)iVar13;
  iVar9 = (int)uVar12;
  uVar12 = (ulong)iVar9;
  if ((lVar7 != 0) || (s < uVar12)) {
    if (iVar13 < iVar9) {
      uVar8 = 0x40U - lVar7;
      if (s <= 0x40U - lVar7) {
        uVar8 = s;
      }
      memcpy(&a[1].archive.field_0x81 + lVar7,buff,uVar8);
      iVar13 = (int)uVar8 + *(int *)((long)&a[1].client_writer + 4);
      *(int *)((long)&a[1].client_writer + 4) = iVar13;
      if (iVar13 < iVar9) {
        return;
      }
    }
    buff = &a[1].archive.field_0x81;
  }
  pcVar1 = &a[1].archive.read_data_is_posix_read;
  *pcVar1 = *pcVar1 & 0xfe;
  if (*buff == 0x7d6dbc99653e437) {
    uVar3 = *(uint *)((long)buff + 8);
    bVar2 = *(byte *)((long)buff + 0xd);
    if ((*(char *)((long)buff + 0xc) == '\x04' && 0x17 < (ulong)uVar3) &&
        0xe7 < (byte)(bVar2 - 0x1f)) {
      uVar10 = (ulong)uVar3 - 1 >> (bVar2 & 0x3f);
      uVar8 = uVar10 * 4 + 0x18;
      if ((long)uVar8 <= (long)uVar6) {
        if (0x17 < (long)uVar12) {
          uVar14 = (long)buff + 0x1c;
          uVar11 = *(uint *)((long)buff + 0x10);
          do {
            if (uVar8 != uVar11) {
              return;
            }
            uVar4 = *(uint *)(uVar14 - 8);
            if (uVar4 < uVar11) {
              return;
            }
            if (uVar6 < uVar4) {
              return;
            }
            bVar15 = uVar10 == 0;
            uVar10 = uVar10 - 1;
            if (bVar15) break;
            uVar8 = uVar8 + (uVar4 - uVar11);
            bVar15 = uVar14 <= uVar12 + (long)buff;
            uVar14 = uVar14 + 4;
            uVar11 = uVar4;
          } while (bVar15);
        }
        *(uint *)(lVar5 + 0xc4) = uVar3;
        *(undefined1 *)(lVar5 + 0xc0) = 4;
        *(byte *)(lVar5 + 0xc1) = bVar2;
        pcVar1 = &a[1].archive.read_data_is_posix_read;
        *pcVar1 = *pcVar1 & 0xfd;
      }
    }
  }
  return;
}

Assistant:

static void
zisofs_detect_magic(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file = iso9660->cur_file;
	const unsigned char *p, *endp;
	const unsigned char *magic_buff;
	uint32_t uncompressed_size;
	unsigned char header_size;
	unsigned char log2_bs;
	size_t _ceil, doff;
	uint32_t bst, bed;
	int magic_max;
	int64_t entry_size;

	entry_size = archive_entry_size(file->entry);
	if ((int64_t)sizeof(iso9660->zisofs.magic_buffer) > entry_size)
		magic_max = (int)entry_size;
	else
		magic_max = sizeof(iso9660->zisofs.magic_buffer);

	if (iso9660->zisofs.magic_cnt == 0 && s >= (size_t)magic_max)
		/* It's unnecessary we copy buffer. */
		magic_buff = buff;
	else {
		if (iso9660->zisofs.magic_cnt < magic_max) {
			size_t l;

			l = sizeof(iso9660->zisofs.magic_buffer)
			    - iso9660->zisofs.magic_cnt;
			if (l > s)
				l = s;
			memcpy(iso9660->zisofs.magic_buffer
			    + iso9660->zisofs.magic_cnt, buff, l);
			iso9660->zisofs.magic_cnt += (int)l;
			if (iso9660->zisofs.magic_cnt < magic_max)
				return;
		}
		magic_buff = iso9660->zisofs.magic_buffer;
	}
	iso9660->zisofs.detect_magic = 0;
	p = magic_buff;

	/* Check the magic code of zisofs. */
	if (memcmp(p, zisofs_magic, sizeof(zisofs_magic)) != 0)
		/* This is not zisofs file which made by mkzftree. */
		return;
	p += sizeof(zisofs_magic);

	/* Read a zisofs header. */
	uncompressed_size = archive_le32dec(p);
	header_size = p[4];
	log2_bs = p[5];
	if (uncompressed_size < 24 || header_size != 4 ||
	    log2_bs > 30 || log2_bs < 7)
		return;/* Invalid or not supported header. */

	/* Calculate a size of Block Pointers of zisofs. */
	_ceil = (uncompressed_size +
	        (ARCHIVE_LITERAL_LL(1) << log2_bs) -1) >> log2_bs;
	doff = (_ceil + 1) * 4 + 16;
	if (entry_size < (int64_t)doff)
		return;/* Invalid data. */

	/* Check every Block Pointer has valid value. */
	p = magic_buff + 16;
	endp = magic_buff + magic_max;
	while (_ceil && p + 8 <= endp) {
		bst = archive_le32dec(p);
		if (bst != doff)
			return;/* Invalid data. */
		p += 4;
		bed = archive_le32dec(p);
		if (bed < bst || bed > entry_size)
			return;/* Invalid data. */
		doff += bed - bst;
		_ceil--;
	}

	file->zisofs.uncompressed_size = uncompressed_size;
	file->zisofs.header_size = header_size;
	file->zisofs.log2_bs = log2_bs;

	/* Disable making a zisofs image. */
	iso9660->zisofs.making = 0;
}